

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

_Bool ext_ml_model_decision_before_none
                (AV1_COMP *cpi,float *features_from_motion,int *partition_none_allowed,
                int *partition_horz_allowed,int *partition_vert_allowed,int *do_rectangular_split,
                int *do_square_split)

{
  _Bool _Var1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 *in_R8;
  undefined4 *in_R9;
  _Bool valid_decision;
  aom_partition_decision_t decision;
  int i;
  aom_partition_features_t features;
  ExtPartController *ext_part_controller;
  aom_partition_decision_t *in_stack_ffffffffffffd480;
  ExtPartController *in_stack_ffffffffffffd488;
  undefined4 local_b70;
  undefined4 local_b6c;
  undefined4 local_b68;
  undefined4 local_b64;
  undefined4 local_b60;
  int local_b3c;
  undefined4 auStack_b34 [701];
  int *local_40;
  undefined4 *local_38;
  undefined4 *local_30;
  undefined4 *local_28;
  undefined4 *local_20;
  _Bool local_1;
  
  local_40 = (int *)(in_RDI + 0x9d528);
  if (*local_40 == 0) {
    local_1 = false;
  }
  else {
    for (local_b3c = 0; local_b3c < 0x11; local_b3c = local_b3c + 1) {
      auStack_b34[local_b3c] = *(undefined4 *)(in_RSI + (long)local_b3c * 4);
    }
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    av1_ext_part_send_features
              (in_stack_ffffffffffffd488,(aom_partition_features_t *)in_stack_ffffffffffffd480);
    _Var1 = av1_ext_part_get_partition_decision(in_stack_ffffffffffffd488,in_stack_ffffffffffffd480)
    ;
    if (_Var1) {
      *local_20 = local_b70;
      *local_28 = local_b6c;
      *local_30 = local_b68;
      *local_38 = local_b64;
      *(undefined4 *)decision._0_8_ = local_b60;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool ext_ml_model_decision_before_none(
    AV1_COMP *cpi, const float features_from_motion[FEATURE_SIZE_SMS_SPLIT],
    int *partition_none_allowed, int *partition_horz_allowed,
    int *partition_vert_allowed, int *do_rectangular_split,
    int *do_square_split) {
  ExtPartController *const ext_part_controller = &cpi->ext_part_controller;
  if (!ext_part_controller->ready) return false;

  // Setup features.
  aom_partition_features_t features;
  features.id = AOM_EXT_PART_FEATURE_BEFORE_NONE;
  for (int i = 0; i < FEATURE_SIZE_SMS_SPLIT; ++i) {
    features.before_part_none.f[i] = features_from_motion[i];
  }

  // Send necessary features to the external model.
  av1_ext_part_send_features(ext_part_controller, &features);

  // Get partition decisions from the external model.
  aom_partition_decision_t decision;
  const bool valid_decision =
      av1_ext_part_get_partition_decision(ext_part_controller, &decision);
  if (!valid_decision) return false;

  // Populate decisions
  *partition_none_allowed = decision.partition_none_allowed;
  *partition_horz_allowed = decision.partition_rect_allowed[HORZ];
  *partition_vert_allowed = decision.partition_rect_allowed[VERT];
  *do_rectangular_split = decision.do_rectangular_split;
  *do_square_split = decision.do_square_split;

  return true;
}